

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O2

Mesh * vera::axisMesh(Mesh *__return_storage_ptr__,float _size,float _y)

{
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_e0;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_dc;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_d8;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_d4;
  float local_d0;
  float local_cc;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  Mesh local_b8;
  
  Mesh::Mesh(__return_storage_ptr__);
  __return_storage_ptr__->m_drawMode = LINES;
  local_cc = 0.0;
  local_e0.x = _size ^ 0x80000000;
  uStack_c4 = in_XMM0_Db ^ 0x80000000;
  uStack_c0 = in_XMM0_Dc ^ 0x80000000;
  uStack_bc = in_XMM0_Dd ^ 0x80000000;
  local_d8 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_dc.x = _y;
  local_d4.x = _size;
  local_d0 = _y;
  local_c8 = local_e0;
  lineMesh(&local_b8,(vec3 *)&local_d4,(vec3 *)&local_e0);
  Mesh::append(__return_storage_ptr__,&local_b8);
  Mesh::~Mesh(&local_b8);
  local_d4.x = 0.0;
  local_cc = 0.0;
  local_e0.x = 0.0;
  local_dc = local_c8;
  local_d8 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_d0 = _size;
  lineMesh(&local_b8,(vec3 *)&local_d4,(vec3 *)&local_e0);
  Mesh::append(__return_storage_ptr__,&local_b8);
  Mesh::~Mesh(&local_b8);
  local_d4.x = 0.0;
  local_e0.x = 0.0;
  local_d8 = local_c8;
  local_dc.x = _y;
  local_d0 = _y;
  local_cc = _size;
  lineMesh(&local_b8,(vec3 *)&local_d4,(vec3 *)&local_e0);
  Mesh::append(__return_storage_ptr__,&local_b8);
  Mesh::~Mesh(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

Mesh axisMesh(float _size, float _y) {
    Mesh mesh;
    mesh.setDrawMode(LINES);

    mesh.append( lineMesh(glm::vec3(_size,_y,0.0), glm::vec3(-_size,_y,0.0)));
    mesh.append( lineMesh(glm::vec3(0.0, _size, 0.0), glm::vec3(0.0, -_size, 0.0)));
    mesh.append( lineMesh(glm::vec3(0.0, _y, _size), glm::vec3(0.0, _y, -_size)));

    return mesh;
}